

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O2

void addMomentum(NeuralNetwork *nn,OptimizerTypeCase optimizerType,double defaultValue,
                double minValue,double maxValue)

{
  NetworkUpdateParameters *this;
  Optimizer *this_00;
  SGDOptimizer *this_01;
  DoubleParameter *this_02;
  DoubleRange *pDVar1;
  
  this = CoreML::Specification::NeuralNetwork::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::mutable_optimizer(this);
  this_01 = CoreML::Specification::Optimizer::mutable_sgdoptimizer(this_00);
  this_02 = CoreML::Specification::SGDOptimizer::mutable_momentum(this_01);
  this_02->defaultvalue_ = defaultValue;
  pDVar1 = CoreML::Specification::DoubleParameter::mutable_range(this_02);
  pDVar1->minvalue_ = minValue;
  pDVar1->maxvalue_ = maxValue;
  return;
}

Assistant:

void addMomentum(Specification::NeuralNetwork *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, double defaultValue, double minValue, double maxValue) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    auto realOptimizer = (::CoreML::Specification::SGDOptimizer*)NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            realOptimizer = optimizer->mutable_sgdoptimizer();
            break;
        default:
            break;
    }
    
    auto momentum = realOptimizer->mutable_momentum();
    
    momentum->set_defaultvalue(defaultValue);
    
    auto doubleRange = momentum->mutable_range();
    doubleRange->set_minvalue(minValue);
    doubleRange->set_maxvalue(maxValue);
}